

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O1

int __thiscall BER_CONTAINER::fromBuffer(BER_CONTAINER *this,uint8_t *buf,size_t max_len)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = -0xc;
  if ((1 < max_len) && (iVar2 = -0xf, this->_type == (uint)*buf)) {
    bVar1 = buf[1];
    if ((char)bVar1 < '\0') {
      if ((bVar1 & 0x7f) == 0) {
        uVar5 = 0;
      }
      else {
        lVar4 = 0;
        uVar5 = 0;
        do {
          uVar5 = (uint)buf[lVar4 + 2] | uVar5 << 8;
          lVar4 = lVar4 + 1;
        } while ((bVar1 & 0x7f) != (uint)lVar4);
      }
      this->_length = uVar5;
      iVar3 = (bVar1 & 0x7f) + 1;
    }
    else {
      this->_length = (uint)bVar1;
      iVar3 = 1;
    }
    iVar2 = -0xb;
    if ((long)this->_length + 2U <= max_len) {
      iVar2 = iVar3 + 1;
    }
  }
  return iVar2;
}

Assistant:

int BER_CONTAINER::fromBuffer(const uint8_t *buf, size_t max_len) {
    // In the base class we are going to double check our type, and decode the length of this structure, then return bytes read
    if(max_len < 2) return SNMP_BUFFER_ERROR_TLV_TOO_SMALL; // Too small for any type

    const uint8_t* ptr = buf;
    if(*ptr != _type){
        SNMP_LOGE("Mismatched type when decoding %d, %d\n", _type, *ptr);
        return SNMP_BUFFER_ERROR_TYPE_MISMATCH;
    }
    ptr++; // type
    ptr += decode_ber_length_integer(ptr, &_length, max_len);
    if((size_t)_length + 2 > max_len){
        // length of object is too big to read in
        return SNMP_BUFFER_ERROR_MAX_LEN_EXCEEDED;
    }

    return ptr - buf;
}